

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O0

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlyFinish
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btContactSolverInfo *infoGlobal)

{
  btAlignedObjectArray<float> *in_RCX;
  undefined8 in_RDI;
  btScalar bVar1;
  btContactSolverInfo *in_stack_00000148;
  int in_stack_00000154;
  btCollisionObject **in_stack_00000158;
  btSequentialImpulseConstraintSolver *in_stack_00000160;
  int newsize;
  
  newsize = (int)((ulong)in_RDI >> 0x20);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  btAlignedObjectArray<float>::resizeNoInitialize(in_RCX,newsize);
  bVar1 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyFinish
                    (in_stack_00000160,in_stack_00000158,in_stack_00000154,in_stack_00000148);
  return bVar1;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlyFinish(btCollisionObject** bodies,int numBodies,const btContactSolverInfo& infoGlobal)
{
	m_pNC.resizeNoInitialize(0);
	m_pC.resizeNoInitialize(0);
	m_pCF.resizeNoInitialize(0);
	m_pCRF.resizeNoInitialize(0);

	m_deltafNC.resizeNoInitialize(0);
	m_deltafC.resizeNoInitialize(0);
	m_deltafCF.resizeNoInitialize(0);
	m_deltafCRF.resizeNoInitialize(0);

	return btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyFinish(bodies, numBodies, infoGlobal);
}